

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeKernelSetArgumentValue
          (ze_kernel_handle_t hKernel,uint32_t argIndex,size_t argSize,void *pArgValue)

{
  ze_pfnKernelSetArgumentValue_t pfnSetArgumentValue;
  ze_result_t result;
  void *pArgValue_local;
  size_t argSize_local;
  uint32_t argIndex_local;
  ze_kernel_handle_t hKernel_local;
  
  pfnSetArgumentValue._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c6b8 != (code *)0x0) {
    pfnSetArgumentValue._4_4_ = (*DAT_0011c6b8)(hKernel,argIndex,argSize,pArgValue);
  }
  return pfnSetArgumentValue._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelSetArgumentValue(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        uint32_t argIndex,                              ///< [in] argument index in range [0, num args - 1]
        size_t argSize,                                 ///< [in] size of argument type
        const void* pArgValue                           ///< [in][optional] argument value represented as matching arg type. If
                                                        ///< null then argument value is considered null.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetArgumentValue = context.zeDdiTable.Kernel.pfnSetArgumentValue;
        if( nullptr != pfnSetArgumentValue )
        {
            result = pfnSetArgumentValue( hKernel, argIndex, argSize, pArgValue );
        }
        else
        {
            // generic implementation
        }

        return result;
    }